

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_formats.c
# Opt level: O3

void fill_derived_format_values(FMContext fmc,FMFormat_conflict format)

{
  FMFieldList p_Var1;
  FMFormat_conflict p_Var2;
  int iVar3;
  FMdata_type FVar4;
  char *str;
  FMVarInfoList p_Var5;
  FMTypeDesc *pFVar6;
  uint uVar7;
  long lVar8;
  FMFormat_conflict *pp_Var9;
  int *piVar10;
  long local_38;
  
  format->context = fmc;
  format->variant = 0;
  format->recursive = 0;
  p_Var1 = format->field_list;
  if (0 < format->field_count) {
    piVar10 = &p_Var1->field_size;
    lVar8 = 0;
    do {
      iVar3 = is_all_static_array_dimens(*(char **)(piVar10 + -2));
      if (((iVar3 != 0) &&
          (FVar4 = FMarray_str_to_data_type(*(char **)(piVar10 + -2),&local_38),
          FVar4 != unknown_type)) && (0x10 < *piVar10)) {
        fprintf(_stderr,
                "Field size for field %s in format %s is large, check to see if it is valid.\n",
                ((_FMField *)(piVar10 + -4))->field_name,format->format_name);
      }
      lVar8 = lVar8 + 1;
      piVar10 = piVar10 + 6;
    } while (lVar8 < format->field_count);
  }
  generate_var_list(format,format->subformats);
  iVar3 = format->field_count;
  if (0 < iVar3) {
    lVar8 = 0;
    do {
      if (format->var_list[lVar8].string == 1) {
        format->variant = 1;
      }
      else {
        str = base_data_type(p_Var1[lVar8].field_type);
        FVar4 = FMstr_to_data_type(str);
        if (FVar4 == unknown_type) {
          pp_Var9 = format->subformats;
          if (pp_Var9 != (FMFormat_conflict *)0x0) {
            p_Var2 = *pp_Var9;
            while (p_Var2 != (FMFormat_conflict)0x0) {
              pp_Var9 = pp_Var9 + 1;
              iVar3 = strcmp(str,p_Var2->format_name);
              if (iVar3 == 0) {
                format->field_subformats[lVar8] = p_Var2;
              }
              p_Var2 = *pp_Var9;
            }
          }
          p_Var5 = format->var_list;
          uVar7 = 1;
          if (p_Var5[lVar8].var_array != 1) {
            if (format->field_subformats[lVar8] == (FMFormat_conflict)0x0) goto LAB_0011e786;
            uVar7 = format->variant | format->field_subformats[lVar8]->variant;
          }
LAB_0011e783:
          format->variant = uVar7;
        }
        else {
          p_Var5 = format->var_list;
          uVar7 = 1;
          if (p_Var5[lVar8].var_array == 1) goto LAB_0011e783;
        }
LAB_0011e786:
        pFVar6 = &p_Var5[lVar8].type_desc;
        do {
          if (pFVar6->type == FMType_pointer) {
            format->variant = 1;
          }
          pFVar6 = pFVar6->next;
        } while (pFVar6 != (FMTypeDesc *)0x0);
        free(str);
        iVar3 = format->field_count;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < iVar3);
  }
  return;
}

Assistant:

static void
fill_derived_format_values(FMContext fmc, FMFormat format)
{
    FMFieldList field_list;
    int field;
    format->context = fmc;
    format->variant = 0;
    format->recursive = 0;
    field_list = format->field_list;
    for (field = 0; field < format->field_count; field++) {
	int field_size = 0;
	if (is_var_array_field(field_list, field) == 1) {
	    /* variant array, real_field_size is format->pointer_size */
	    field_size = format->pointer_size;
	} else {
	    long elements = 1;
	    FMdata_type base_type;
	    base_type = FMarray_str_to_data_type(field_list[field].field_type,
					       &elements);
	    if ((base_type != unknown_type) &&
		(field_list[field].field_size > 16)) {
		fprintf(stderr, "Field size for field %s in format %s is large, check to see if it is valid.\n",
			field_list[field].field_name, format->format_name);
	    }
	    field_size = field_list[field].field_size * elements;
	}
	(void) field_size;
    }
    generate_var_list(format, format->subformats);
    for (field = 0; field < format->field_count; field++) {
	if (format->var_list[field].string == 1) {
	    format->variant = 1;
	} else {
	    char *base_type =
		base_data_type(field_list[field].field_type);
	    FMFormat subformat = NULL;
	    FMTypeDesc* desc = NULL;

	    /* if field is of another record format, fill that in */
	    if (FMstr_to_data_type(base_type) == unknown_type) {
	        FMFormat *subformats = format->subformats;
		while (subformats && subformats[0]) {
		    if (strcmp(base_type, subformats[0]->format_name) == 0) {
		    
		        format->field_subformats[field] = subformats[0];
		    }
		    subformats++;
		}
		subformat = format->field_subformats[field];
	    }
	    if (format->var_list[field].var_array == 1) {
		/* got a variant array */
		format->variant = 1;
	    } else {
		/* if field is variant by its subformat being variant */
		if (subformat != NULL) {
		    format->variant |= subformat->variant;
		}
	    }
	    desc = &format->var_list[field].type_desc;
	    while (desc != NULL) {
		if (desc->type == FMType_pointer) format->variant = 1;
		desc = desc->next;
	    }
	    free(base_type);
	}
    }
}